

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.cpp
# Opt level: O0

bool __thiscall slang::syntax::SyntaxNode::isEquivalentTo(SyntaxNode *this,SyntaxNode *other)

{
  bool bVar1;
  bool bVar2;
  SyntaxNode *this_00;
  SyntaxNode *pSVar3;
  SyntaxNode *pSVar4;
  SyntaxNode *in_RSI;
  SyntaxNode *in_RDI;
  Token TVar5;
  Token TVar6;
  string_view __x;
  Token rt;
  Token lt;
  SyntaxNode *rn;
  SyntaxNode *ln;
  size_t i;
  size_t childCount;
  SyntaxNode *in_stack_ffffffffffffff78;
  string_view in_stack_ffffffffffffff88;
  TokenKind local_58;
  TokenKind local_48;
  SyntaxNode *local_28;
  SyntaxNode *other_00;
  bool local_1;
  
  this_00 = (SyntaxNode *)getChildCount(in_stack_ffffffffffffff78);
  if ((in_RDI->kind == in_RSI->kind) &&
     (other_00 = this_00, pSVar3 = (SyntaxNode *)getChildCount(this_00), this_00 == pSVar3)) {
    for (local_28 = (SyntaxNode *)0x0; local_28 < other_00;
        local_28 = (SyntaxNode *)((long)&local_28->kind + 1)) {
      pSVar3 = childNode((SyntaxNode *)in_stack_ffffffffffffff88._M_len,(size_t)in_RDI);
      pSVar4 = childNode((SyntaxNode *)in_stack_ffffffffffffff88._M_len,(size_t)in_RDI);
      if ((pSVar3 != (SyntaxNode *)0x0) != (pSVar4 != (SyntaxNode *)0x0)) {
        return false;
      }
      if (pSVar3 == (SyntaxNode *)0x0) {
        TVar5 = childToken(in_RDI,(size_t)this_00);
        TVar6 = childToken(in_RDI,(size_t)this_00);
        bVar1 = parsing::Token::operator_cast_to_bool((Token *)0xc785d3);
        bVar2 = parsing::Token::operator_cast_to_bool((Token *)0xc785e6);
        if (bVar1 != bVar2) {
          return false;
        }
        bVar1 = parsing::Token::operator_cast_to_bool((Token *)0xc7860d);
        if (bVar1) {
          local_48 = TVar5.kind;
          local_58 = TVar6.kind;
          if (local_48 != local_58) {
            return false;
          }
          __x = parsing::Token::valueText((Token *)in_RDI);
          in_stack_ffffffffffffff88 = parsing::Token::valueText((Token *)in_RDI);
          bVar1 = std::operator==(__x,in_stack_ffffffffffffff88);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            return false;
          }
        }
      }
      else {
        bVar1 = isEquivalentTo(in_RSI,other_00);
        if (!bVar1) {
          return false;
        }
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SyntaxNode::isEquivalentTo(const SyntaxNode& other) const {
    size_t childCount = getChildCount();
    if (kind != other.kind || childCount != other.getChildCount())
        return false;

    for (size_t i = 0; i < childCount; i++) {
        auto ln = childNode(i);
        auto rn = other.childNode(i);
        if (bool(ln) != bool(rn))
            return false;

        if (ln) {
            if (!ln->isEquivalentTo(*rn))
                return false;
        }
        else {
            Token lt = childToken(i);
            Token rt = other.childToken(i);
            if (bool(lt) != bool(rt))
                return false;

            if (lt) {
                if (lt.kind != rt.kind || lt.valueText() != rt.valueText())
                    return false;
            }
        }
    }
    return true;
}